

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::ReservoirQuantileScalarOperation>
               (hugeint_t *idata,AggregateInputData *aggr_input_data,
               ReservoirQuantileState<duckdb::hugeint_t> **states,ValidityMask *mask,idx_t count)

{
  AggregateUnaryInput *pAVar1;
  bool bVar2;
  idx_t iVar3;
  ReservoirQuantileState<duckdb::hugeint_t> *state;
  AggregateUnaryInput *input_00;
  TemplatedValidityMask<unsigned_long> *in_RCX;
  AggregateInputData *in_RSI;
  unsigned_long in_R8;
  idx_t *i;
  AggregateUnaryInput input_1;
  idx_t start;
  idx_t next;
  unsigned_long validity_entry;
  idx_t entry_idx;
  idx_t entry_count;
  idx_t *base_idx;
  AggregateUnaryInput input;
  AggregateInputData *in_stack_ffffffffffffff70;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff78;
  ulong local_80;
  idx_t local_78;
  AggregateUnaryInput *in_stack_ffffffffffffff90;
  AggregateUnaryInput *unary_input;
  hugeint_t *in_stack_ffffffffffffff98;
  ReservoirQuantileState<duckdb::hugeint_t> *in_stack_ffffffffffffffa0;
  ulong local_58;
  AggregateUnaryInput local_40;
  unsigned_long local_28;
  TemplatedValidityMask<unsigned_long> *local_20;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_10 = in_RSI;
  bVar2 = ReservoirQuantileOperation::IgnoreNull();
  if ((!bVar2) || (bVar2 = TemplatedValidityMask<unsigned_long>::AllValid(local_20), bVar2)) {
    AggregateUnaryInput::AggregateUnaryInput
              ((AggregateUnaryInput *)&stack0xffffffffffffff70,local_10,(ValidityMask *)local_20);
    for (local_80 = 0; local_80 < local_28; local_80 = local_80 + 1) {
      ReservoirQuantileOperation::
      Operation<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::ReservoirQuantileScalarOperation>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
  }
  else {
    AggregateUnaryInput::AggregateUnaryInput(&local_40,local_10,(ValidityMask *)local_20);
    local_40.input_idx = 0;
    iVar3 = TemplatedValidityMask<unsigned_long>::EntryCount(0xab8fa4);
    for (local_58 = 0; local_58 < iVar3; local_58 = local_58 + 1) {
      state = (ReservoirQuantileState<duckdb::hugeint_t> *)
              TemplatedValidityMask<unsigned_long>::GetValidityEntry
                        (in_stack_ffffffffffffff78,(idx_t)in_stack_ffffffffffffff70);
      input_00 = (AggregateUnaryInput *)
                 MinValue<unsigned_long>
                           ((unsigned_long)
                            &((AggregateUnaryInput *)(local_40.input_idx + 0x30))->input_idx,
                            local_28);
      bVar2 = TemplatedValidityMask<unsigned_long>::AllValid((unsigned_long)state);
      if (bVar2) {
        for (; pAVar1 = (AggregateUnaryInput *)local_40.input_idx, local_40.input_idx < input_00;
            local_40.input_idx = (long)(AggregateInputData **)local_40.input_idx + 1) {
          ReservoirQuantileOperation::
          Operation<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::ReservoirQuantileScalarOperation>
                    (state,(hugeint_t *)input_00,in_stack_ffffffffffffff90);
        }
      }
      else {
        bVar2 = TemplatedValidityMask<unsigned_long>::NoneValid((unsigned_long)state);
        unary_input = (AggregateUnaryInput *)local_40.input_idx;
        pAVar1 = input_00;
        if (!bVar2) {
          for (; in_stack_ffffffffffffff90 = unary_input,
              pAVar1 = (AggregateUnaryInput *)local_40.input_idx, local_40.input_idx < input_00;
              local_40.input_idx = (long)(AggregateInputData **)local_40.input_idx + 1) {
            local_78 = local_40.input_idx - (long)unary_input;
            bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              ((unsigned_long *)&stack0xffffffffffffffa0,&local_78);
            if (bVar2) {
              ReservoirQuantileOperation::
              Operation<duckdb::hugeint_t,duckdb::ReservoirQuantileState<duckdb::hugeint_t>,duckdb::ReservoirQuantileScalarOperation>
                        (state,(hugeint_t *)input_00,unary_input);
            }
          }
        }
      }
      local_40.input_idx = (idx_t)pAVar1;
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}